

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enumerate_tests.cpp
# Opt level: O2

void __thiscall
omp_enumerate_array_iterator_types_Test::omp_enumerate_array_iterator_types_Test
          (omp_enumerate_array_iterator_types_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001859f8;
  return;
}

Assistant:

TEST(omp_enumerate, array_iterator_types) {
  int arr[] = {1, 2, 3, 4, 5};

  auto e_is_iterator =
      std::is_same_v<int *, typename decltype(omp::enumerate(
                                arr))::iterator::wrapped_iterator>;

  auto e_is_citerator =
      std::is_same_v<const int *,
                     typename decltype(omp::enumerate(
                         std::as_const(arr)))::iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_iterator && e_is_citerator);

  auto e_is_citerator_1 =
      std::is_same_v<const int *, typename decltype(omp::enumerate(
                                      arr))::const_iterator::wrapped_iterator>;

  ASSERT_TRUE(e_is_citerator_1);
}